

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::RunInTerminalRequest>::construct
          (BasicTypeInfo<dap::RunInTerminalRequest> *this,void *ptr)

{
  memset(ptr,0,0xd0);
  RunInTerminalRequest::RunInTerminalRequest((RunInTerminalRequest *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }